

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player-properties.c
# Opt level: O3

void textui_interact_with_specialties(void)

{
  _Bool _Var1;
  ui_event answer;
  ui_event local_1c;
  
  do {
    _Var1 = get_com_ex("View abilities or Learn specialty (l/v/ESC)?",&local_1c);
    if (!_Var1) {
      return;
    }
    if ((local_1c.key.code & 0xffffffdf) == 0x56) {
      view_abilities();
      return;
    }
    if ((local_1c.key.code & 0xffffffdf) == 0x4c) {
      gain_specialty();
      return;
    }
  } while (local_1c.key.code != 0xe000);
  return;
}

Assistant:

void textui_interact_with_specialties(void)
{
	ui_event answer;

	/* Interact and choose. */
	while (get_com_ex
		   ("View abilities or Learn specialty (l/v/ESC)?", &answer)) {
		/* New ability */
		if ((answer.key.code == 'L') || (answer.key.code == 'l')) {
			gain_specialty();
			break;
		}

		/* View Current */
		if ((answer.key.code == 'V') || (answer.key.code == 'v')) {
			view_abilities();
			break;
		}

		/* Exit */
		if (answer.key.code == ESCAPE)
			break;
	}
}